

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

double __thiscall VCClusterQuad::energyWithItem(VCClusterQuad *this,VCFace *f)

{
  long in_RSI;
  long in_RDI;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  ReturnType RVar1;
  Vector3d zi;
  double a;
  Vector3d ws;
  Matrix4d Eo;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffed8;
  Scalar *in_stack_fffffffffffffee0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_stack_fffffffffffffee8;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffef0;
  VCClusterQuad *in_stack_fffffffffffffef8;
  
  Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator+
            ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)in_stack_fffffffffffffef8,
             (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)in_stack_fffffffffffffef0);
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,4,4,0,4,4>const,Eigen::Matrix<double,4,4,0,4,4>const>>
            ((Matrix<double,_4,_4,_0,_4,_4> *)in_stack_fffffffffffffef0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              *)in_stack_fffffffffffffee8);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  this_00 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
            (*(double *)(in_RDI + 0x58) + *(double *)(in_RSI + 0x120));
  center(in_stack_fffffffffffffef8,(Matrix4d *)in_stack_fffffffffffffef0);
  other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
          Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    (this_00,in_stack_fffffffffffffed8);
  RVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    (this_00,other);
  return (double)this_00 * (double)other + -(RVar1 * 2.0);
}

Assistant:

double VCClusterQuad::energyWithItem(VCFace* f) {
	Matrix4d Eo = E + f->E;
	Vector3d ws = weightedSum + f->center * f->area;
	double a = area + f->area;
	Vector3d zi = center(Eo);
	return a * zi.dot(zi) - 2 * zi.dot(ws);
}